

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void __thiscall QDomElement::removeAttributeNS(QDomElement *this,QString *nsURI,QString *localName)

{
  QDomElementPrivate *pQVar1;
  QDomAttrPrivate *pQVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QDomElementPrivate *)(this->super_QDomNode).impl;
  if (pQVar1 != (QDomElementPrivate *)0x0) {
    pQVar2 = QDomElementPrivate::attributeNodeNS(pQVar1,nsURI,localName);
    if (pQVar2 != (QDomAttrPrivate *)0x0) {
      pQVar1 = (QDomElementPrivate *)(this->super_QDomNode).impl;
      local_28.d = (pQVar2->super_QDomNodePrivate).name.d.d;
      local_28.ptr = (pQVar2->super_QDomNodePrivate).name.d.ptr;
      local_28.size = (pQVar2->super_QDomNodePrivate).name.d.size;
      if (local_28.d != (Data *)0x0) {
        LOCK();
        ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_28.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QDomElementPrivate::removeAttribute(pQVar1,(QString *)&local_28);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDomElement::removeAttributeNS(const QString& nsURI, const QString& localName)
{
    if (!impl)
        return;
    QDomNodePrivate *n = IMPL->attributeNodeNS(nsURI, localName);
    if (!n)
        return;
    IMPL->removeAttribute(n->nodeName());
}